

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

mz_bool mz_zip_reader_extract_to_mem_no_alloc
                  (mz_zip_archive *pZip,mz_uint file_index,void *pBuf,size_t buf_size,mz_uint flags,
                  void *pUser_read_buf,size_t user_read_buf_size)

{
  bool bVar1;
  mz_bool mVar2;
  tinfl_status tVar3;
  size_t sVar4;
  size_t sVar5;
  mz_ulong mVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  mz_uint64 mVar11;
  size_t out_buf_size;
  size_t in_buf_size;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  tinfl_decompressor inflator;
  ulong local_2dd0;
  mz_uint64 local_2db8;
  size_t local_2da8;
  size_t local_2da0;
  int local_2d98 [6];
  ushort local_2d7e;
  ushort local_2d7c;
  mz_zip_archive_file_stat local_2d70;
  tinfl_decompressor local_2b28;
  
  if ((pBuf != (void *)0x0 || buf_size == 0) &&
     (mVar2 = mz_zip_reader_file_stat(pZip,file_index,&local_2d70), mVar11 = local_2d70.m_comp_size,
     mVar2 != 0)) {
    if (local_2d70.m_comp_size == 0) {
      return 1;
    }
    mVar2 = mz_zip_reader_is_file_a_directory(pZip,file_index);
    if (mVar2 != 0) {
      return 1;
    }
    if ((((byte)local_2d70.m_bit_flag & 0x21) == 0) &&
       (((flags >> 10 & 1) != 0 || ((local_2d70.m_method & 0xfff7) == 0)))) {
      if ((flags >> 10 & 1) == 0) {
        mVar11 = local_2d70.m_uncomp_size;
      }
      if (((mVar11 <= buf_size) &&
          (sVar4 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2d70.m_local_header_ofs,local_2d98,0x1e
                                   ), sVar4 == 0x1e)) && (local_2d98[0] == 0x4034b50)) {
        local_2dd0 = local_2d70.m_comp_size;
        if (local_2d70.m_local_header_ofs + local_2d7e + (ulong)local_2d7c + local_2d70.m_comp_size
            + 0x1e <= pZip->m_archive_size) {
          local_2db8 = (ulong)local_2d7c + local_2d70.m_local_header_ofs + local_2d7e + 0x1e;
          if (((flags >> 10 & 1) != 0) || (local_2d70.m_method == 0)) {
            sVar4 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2db8,pBuf,mVar11);
            if ((flags >> 10 & 1) != 0) {
              return (uint)(sVar4 == mVar11);
            }
            if (sVar4 != mVar11) {
              return (uint)(sVar4 == mVar11);
            }
            mVar6 = mz_crc32(0,(mz_uint8 *)pBuf,local_2d70.m_uncomp_size);
            return (uint)(mVar6 == local_2d70.m_crc32);
          }
          local_2b28.m_state = 0;
          pvVar7 = pZip->m_pState->m_pMem;
          if (pvVar7 == (void *)0x0) {
            if (pUser_read_buf == (void *)0x0) {
              if (0xffff < local_2d70.m_comp_size) {
                local_2dd0 = 0x10000;
              }
              pvVar7 = (*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,local_2dd0);
              if (pvVar7 == (void *)0x0) {
                return 0;
              }
              uVar10 = 0;
              uVar8 = local_2d70.m_comp_size;
            }
            else {
              local_2dd0 = user_read_buf_size;
              uVar10 = 0;
              uVar8 = local_2d70.m_comp_size;
              pvVar7 = pUser_read_buf;
              if (user_read_buf_size == 0) {
                return 0;
              }
            }
          }
          else {
            uVar8 = 0;
            uVar10 = local_2d70.m_comp_size;
            pvVar7 = (void *)((long)pvVar7 + local_2db8);
          }
          sVar4 = 0;
          lVar9 = 0;
          do {
            local_2da8 = local_2d70.m_uncomp_size - sVar4;
            if (uVar10 == 0) {
              if (pZip->m_pState->m_pMem != (void *)0x0) {
                uVar10 = 0;
                goto LAB_00194593;
              }
              uVar10 = uVar8;
              if (local_2dd0 < uVar8) {
                uVar10 = local_2dd0;
              }
              sVar5 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2db8,pvVar7,uVar10);
              if (sVar5 == uVar10) {
                local_2db8 = local_2db8 + uVar10;
                uVar8 = uVar8 - uVar10;
                lVar9 = 0;
                goto LAB_00194593;
              }
              tVar3 = TINFL_STATUS_FAILED;
              bVar1 = false;
            }
            else {
LAB_00194593:
              local_2da0 = uVar10;
              tVar3 = tinfl_decompress(&local_2b28,(mz_uint8 *)((long)pvVar7 + lVar9),&local_2da0,
                                       (mz_uint8 *)pBuf,(mz_uint8 *)((long)pBuf + sVar4),&local_2da8
                                       ,(uVar8 != 0) + 4 + (uint)(uVar8 != 0));
              uVar10 = uVar10 - local_2da0;
              lVar9 = lVar9 + local_2da0;
              sVar4 = sVar4 + local_2da8;
              bVar1 = true;
            }
          } while ((bVar1) && (tVar3 == TINFL_STATUS_NEEDS_MORE_INPUT));
          mVar2 = 0;
          if (tVar3 == TINFL_STATUS_DONE) {
            if (sVar4 == local_2d70.m_uncomp_size) {
              mVar6 = mz_crc32(0,(mz_uint8 *)pBuf,local_2d70.m_uncomp_size);
              mVar2 = 1;
              if (mVar6 == local_2d70.m_crc32) goto LAB_0019467f;
            }
            mVar2 = 0;
          }
LAB_0019467f:
          if (pUser_read_buf != (void *)0x0 || pZip->m_pState->m_pMem != (void *)0x0) {
            return mVar2;
          }
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pvVar7);
          return mVar2;
        }
      }
    }
  }
  return 0;
}

Assistant:

mz_bool mz_zip_reader_extract_to_mem_no_alloc(mz_zip_archive *pZip,
                                              mz_uint file_index, void *pBuf,
                                              size_t buf_size, mz_uint flags,
                                              void *pUser_read_buf,
                                              size_t user_read_buf_size) {
  int status = TINFL_STATUS_DONE;
  mz_uint64 needed_size, cur_file_ofs, comp_remaining,
      out_buf_ofs = 0, read_buf_size, read_buf_ofs = 0, read_buf_avail;
  mz_zip_archive_file_stat file_stat;
  void *pRead_buf;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
  tinfl_decompressor inflator;

  if ((buf_size) && (!pBuf))
    return MZ_FALSE;

  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;

  // Empty file, or a directory (but not always a directory - I've seen odd zips
  // with directories that have compressed data which inflates to 0 bytes)
  if (!file_stat.m_comp_size)
    return MZ_TRUE;

  // Entry is a subdirectory (I've seen old zips with dir entries which have
  // compressed deflate data which inflates to 0 bytes, but these entries claim
  // to uncompress to 512 bytes in the headers).
  // I'm torn how to handle this case - should it fail instead?
  if (mz_zip_reader_is_file_a_directory(pZip, file_index))
    return MZ_TRUE;

  // Encryption and patch files are not supported.
  if (file_stat.m_bit_flag & (1 | 32))
    return MZ_FALSE;

  // This function only supports stored and deflate.
  if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) &&
      (file_stat.m_method != MZ_DEFLATED))
    return MZ_FALSE;

  // Ensure supplied output buffer is large enough.
  needed_size = (flags & MZ_ZIP_FLAG_COMPRESSED_DATA) ? file_stat.m_comp_size
                                                      : file_stat.m_uncomp_size;
  if (buf_size < needed_size)
    return MZ_FALSE;

  // Read and parse the local directory entry.
  cur_file_ofs = file_stat.m_local_header_ofs;
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pLocal_header,
                    MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return MZ_FALSE;

  cur_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
    return MZ_FALSE;

  if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method)) {
    // The file is stored or the caller has requested the compressed data.
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf,
                      (size_t)needed_size) != needed_size)
      return MZ_FALSE;
    return ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) != 0) ||
           (mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf,
                     (size_t)file_stat.m_uncomp_size) == file_stat.m_crc32);
  }

  // Decompress the file either directly from memory or from a file input
  // buffer.
  tinfl_init(&inflator);

  if (pZip->m_pState->m_pMem) {
    // Read directly from the archive in memory.
    pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + cur_file_ofs;
    read_buf_size = read_buf_avail = file_stat.m_comp_size;
    comp_remaining = 0;
  } else if (pUser_read_buf) {
    // Use a user provided read buffer.
    if (!user_read_buf_size)
      return MZ_FALSE;
    pRead_buf = (mz_uint8 *)pUser_read_buf;
    read_buf_size = user_read_buf_size;
    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  } else {
    // Temporarily allocate a read buffer.
    read_buf_size = MZ_MIN(file_stat.m_comp_size, MZ_ZIP_MAX_IO_BUF_SIZE);
#ifdef _MSC_VER
    if (((0, sizeof(size_t) == sizeof(mz_uint32))) &&
        (read_buf_size > 0x7FFFFFFF))
#else
    if (((sizeof(size_t) == sizeof(mz_uint32))) && (read_buf_size > 0x7FFFFFFF))
#endif
      return MZ_FALSE;
    if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                            (size_t)read_buf_size)))
      return MZ_FALSE;
    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  }

  do {
    size_t in_buf_size,
        out_buf_size = (size_t)(file_stat.m_uncomp_size - out_buf_ofs);
    if ((!read_buf_avail) && (!pZip->m_pState->m_pMem)) {
      read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
      if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf,
                        (size_t)read_buf_avail) != read_buf_avail) {
        status = TINFL_STATUS_FAILED;
        break;
      }
      cur_file_ofs += read_buf_avail;
      comp_remaining -= read_buf_avail;
      read_buf_ofs = 0;
    }
    in_buf_size = (size_t)read_buf_avail;
    status = tinfl_decompress(
        &inflator, (mz_uint8 *)pRead_buf + read_buf_ofs, &in_buf_size,
        (mz_uint8 *)pBuf, (mz_uint8 *)pBuf + out_buf_ofs, &out_buf_size,
        TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF |
            (comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0));
    read_buf_avail -= in_buf_size;
    read_buf_ofs += in_buf_size;
    out_buf_ofs += out_buf_size;
  } while (status == TINFL_STATUS_NEEDS_MORE_INPUT);

  if (status == TINFL_STATUS_DONE) {
    // Make sure the entire file was decompressed, and check its CRC.
    if ((out_buf_ofs != file_stat.m_uncomp_size) ||
        (mz_crc32(MZ_CRC32_INIT, (const mz_uint8 *)pBuf,
                  (size_t)file_stat.m_uncomp_size) != file_stat.m_crc32))
      status = TINFL_STATUS_FAILED;
  }

  if ((!pZip->m_pState->m_pMem) && (!pUser_read_buf))
    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);

  return status == TINFL_STATUS_DONE;
}